

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

bool isDehFile(int lumpnum)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  
  pcVar2 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  __s1 = strrchr(pcVar2,0x2e);
  if ((__s1 != (char *)0x0) && (pcVar2 = strchr(pcVar2,0x2f), pcVar2 == (char *)0x0)) {
    iVar1 = strcasecmp(__s1,".deh");
    if (iVar1 != 0) {
      iVar1 = strcasecmp(__s1,".bex");
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

static bool isDehFile(int lumpnum)
{
	const char* const fullName  = Wads.GetLumpFullName(lumpnum);
	const char* const extension = strrchr(fullName, '.');

	return NULL != extension && strchr(fullName, '/') == NULL
		&& (0 == stricmp(extension, ".deh") || 0 == stricmp(extension, ".bex"));
}